

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_front(void)

{
  reference piVar1;
  initializer_list<int> input;
  int local_74 [3];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_74[0] = 0xb;
  local_74[1] = 0x16;
  local_74[2] = 0x21;
  input._M_len = 3;
  input._M_array = local_74;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  local_74[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd2,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x2c);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  local_74[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd4,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x37);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front(&span);
  local_74[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd6,"void api_dynamic_suite::dynamic_front()",piVar1,local_74);
  return;
}

Assistant:

void dynamic_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(44);
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(55);
    BOOST_TEST_EQ(span.front(), 22);
}